

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void helper_syscall_x86_64(CPUX86State *env,int next_eip_addend)

{
  void *pvVar1;
  list_item *plVar2;
  
  for (plVar2 = env->uc->hook[1].head;
      (plVar2 != (list_item *)0x0 && (pvVar1 = plVar2->data, pvVar1 != (void *)0x0));
      plVar2 = plVar2->next) {
    if (*(char *)((long)pvVar1 + 0x14) == '\0') {
      if (((*(ulong *)((long)pvVar1 + 0x18) <= env->eip) &&
          (env->eip <= *(ulong *)((long)pvVar1 + 0x20))) ||
         (*(ulong *)((long)pvVar1 + 0x20) < *(ulong *)((long)pvVar1 + 0x18))) {
        if (*(int *)((long)pvVar1 + 4) == 699) {
          (**(code **)((long)pvVar1 + 0x28))(env->uc,*(undefined8 *)((long)pvVar1 + 0x30));
        }
        if (env->uc->stop_request != false) break;
      }
    }
  }
  env->eip = env->eip + (long)next_eip_addend;
  return;
}

Assistant:

void helper_syscall(CPUX86State *env, int next_eip_addend)
{
    // Unicorn: call registered syscall hooks
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(env->uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (!HOOK_BOUND_CHECK(hook, env->eip))
            continue;
        if (hook->insn == UC_X86_INS_SYSCALL)
            ((uc_cb_insn_syscall_t)hook->callback)(env->uc, hook->user_data);

        // the last callback may already asked to stop emulation
        if (env->uc->stop_request)
            break;
    }

    env->eip += next_eip_addend;
}